

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

int __thiscall SkipList::randomHeight(SkipList *this)

{
  int iVar1;
  int iVar2;
  
  srand(10000);
  iVar2 = -1;
  do {
    iVar2 = iVar2 + 1;
    iVar1 = std::experimental::fundamentals_v2::randint<int>(0,10000);
    if (4999 < iVar1) {
      return iVar2;
    }
  } while (iVar2 < this->MAX_HEIGHT);
  return iVar2;
}

Assistant:

int SkipList::randomHeight() {
    int rand_height = 0;
    std::srand(10000);
    while (std::experimental::randint(0, 10000) < 5000 && rand_height < MAX_HEIGHT) {
        ++rand_height;
    }
    return rand_height;
}